

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint32_t num;
  char str [50];
  
  while( true ) {
    printf("Please input a number: ");
    pcVar2 = fgets(str,0x32,_stdin);
    if (pcVar2 == (char *)0x0) {
      putchar(10);
      return 0;
    }
    iVar1 = __isoc99_sscanf(str,"%u",&num);
    if (iVar1 != 0) break;
    puts("Invalid number!");
  }
  decompose(num);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  uint32_t num;

  while (true) {
    printf("Please input a number: ");
    char str[50];
    if (fgets(str, 50, stdin) == NULL) {
      printf("\n");
      return 0;
    }
    if (sscanf(str, "%" SCNu32, &num)) break;
    else printf("Invalid number!\n");
  }

  decompose(num);
}